

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsReadName(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins)

{
  Wlc_Ntk_t *p_00;
  int Id;
  int iVar1;
  char *pcVar2;
  Vec_Int_t *vFanins_00;
  Wlc_Obj_t *pWVar3;
  char *format;
  int XValue;
  int Signed;
  int Range;
  int fFound;
  char *pName;
  
  pcVar2 = Wlc_PrsSkipSpaces(pStr);
  if ((byte)(*pcVar2 - 0x3aU) < 0xf6) {
    pcVar2 = Wlc_PrsFindName(pcVar2,&pName);
    if (pcVar2 == (char *)0x0) {
      Wlc_PrsWriteErrorMessage(p,(char *)0x0,"Cannot read name in assign-statement.");
      return (char *)0x0;
    }
    Id = Abc_NamStrFindOrAdd(p->pNtk->pManName,pName,&fFound);
    if (fFound != 0) {
LAB_00313d47:
      Vec_IntPush(vFanins,Id);
      pcVar2 = Wlc_PrsSkipSpaces(pcVar2);
      return pcVar2;
    }
    format = "Name %s is used but not declared.";
  }
  else {
    XValue = 0;
    vFanins_00 = Vec_IntAlloc(0);
    pcVar2 = Wlc_PrsReadConstant(p,pcVar2,vFanins_00,&Range,&Signed,&XValue);
    if (pcVar2 == (char *)0x0) {
      Vec_IntFree(vFanins_00);
      return (char *)0x0;
    }
    Id = Wlc_ObjAlloc(p->pNtk,6,Signed,Range + -1,0);
    p_00 = p->pNtk;
    pWVar3 = Wlc_NtkObj(p_00,Id);
    Wlc_ObjAddFanins(p_00,pWVar3,vFanins_00);
    iVar1 = XValue;
    pWVar3 = Wlc_NtkObj(p->pNtk,Id);
    *(ushort *)pWVar3 = (ushort)*(undefined4 *)pWVar3 & 0xf7ff | (ushort)((iVar1 & 1U) << 0xb);
    Vec_IntFree(vFanins_00);
    p->nConsts = p->nConsts + 1;
    sprintf((char *)&pName,"_c%d_");
    iVar1 = Abc_NamStrFindOrAdd(p->pNtk->pManName,(char *)&pName,&fFound);
    if (fFound == 0) {
      if (Id != iVar1) {
        __assert_fail("iObj == NameId",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                      ,0x291,"char *Wlc_PrsReadName(Wlc_Prs_t *, char *, Vec_Int_t *)");
      }
      goto LAB_00313d47;
    }
    format = "Name %s is already used.";
    pName = (char *)&pName;
  }
  Wlc_PrsWriteErrorMessage(p,pcVar2,format,pName);
  return (char *)0x0;
}

Assistant:

static inline char * Wlc_PrsReadName( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins )
{
    int NameId, fFound, iObj;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( Wlc_PrsIsDigit(pStr) )
    {
        char Buffer[100];
        int Range, Signed, XValue = 0;
        Vec_Int_t * vFanins = Vec_IntAlloc(0);
        pStr = Wlc_PrsReadConstant( p, pStr, vFanins, &Range, &Signed, &XValue );
        if ( pStr == NULL )
        {
            Vec_IntFree( vFanins );
            return 0;
        }
        // create new node
        iObj = Wlc_ObjAlloc( p->pNtk, WLC_OBJ_CONST, Signed, Range-1, 0 );
        Wlc_ObjAddFanins( p->pNtk, Wlc_NtkObj(p->pNtk, iObj), vFanins );
        Wlc_NtkObj(p->pNtk, iObj)->fXConst = XValue;
        Vec_IntFree( vFanins );
        // add node's name
        sprintf( Buffer, "_c%d_", p->nConsts++ );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, Buffer, &fFound );
        if ( fFound )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is already used.", Buffer );
        assert( iObj == NameId );
    }
    else
    {
        char * pName;
        pStr = Wlc_PrsFindName( pStr, &pName );
        if ( pStr == NULL )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in assign-statement." );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, pName, &fFound );
        if ( !fFound )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is used but not declared.", pName );
    }
    Vec_IntPush( vFanins, NameId );
    return Wlc_PrsSkipSpaces( pStr );
}